

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpStreamReader.cpp
# Opt level: O1

string * __thiscall
MLPStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,MLPStreamReader *this)

{
  MlpSubType MVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ostringstream str;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  MVar1 = (this->super_MLPCodec).m_subType;
  if (MVar1 == stMLP) {
    lVar3 = 3;
    pcVar4 = "MLP";
  }
  else {
    lVar3 = 7;
    if (MVar1 == stTRUEHD) {
      pcVar4 = "TRUE-HD";
    }
    else {
      pcVar4 = "UNKNOWN";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,pcVar4,lVar3);
  if ((this->super_MLPCodec).m_substreams == '\x04') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188," + ATMOS",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,". ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"Peak bitrate: ",0xe);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)aoStack_188,(this->super_MLPCodec).m_bitrate / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Kbps ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"Sample Rate: ",0xd);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)aoStack_188,(this->super_MLPCodec).m_samplerate / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"KHz ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"Channels: ",10);
  std::ostream::operator<<((ostream *)aoStack_188,(uint)(this->super_MLPCodec).m_channels);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

const std::string MLPStreamReader::getStreamInfo()
{
    std::ostringstream str;

    if (m_subType == MlpSubType::stTRUEHD)
        str << "TRUE-HD";
    else if (m_subType == MlpSubType::stMLP)
        str << "MLP";
    else
        str << "UNKNOWN";

    if (m_substreams == 4)
        str << " + ATMOS";
    str << ". ";
    str << "Peak bitrate: " << m_bitrate / 1000 << "Kbps ";
    str << "Sample Rate: " << m_samplerate / 1000 << "KHz ";
    str << "Channels: " << static_cast<int>(m_channels);
    return str.str();
}